

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::TryParseExtendedUnicodeEscape
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Char *c,bool *previousSurrogatePart,
          bool trackSurrogatePair)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  Char CVar4;
  undefined4 *puVar5;
  EncodedChar *pEVar6;
  ulong uVar7;
  EncodedChar *pEVar8;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_00;
  uint codePoint;
  uint uVar9;
  uint uVar10;
  undefined4 *local_48;
  char16 local_3a;
  Parser<UTF8EncodingPolicyBase<false>,_true> *pPStack_38;
  char16 other;
  
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
    pEVar8 = this->next;
    if (this->inputLim < pEVar8 + 2) {
      return 0;
    }
    pPStack_38 = this;
    if (this->inputLim < pEVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ecfa87;
      *puVar5 = 0;
      pEVar8 = pPStack_38->next;
    }
    if (*pEVar8 != '{') {
      return 0;
    }
    if (pPStack_38->inputLim < pEVar8 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ecfa87;
      *puVar5 = 0;
      pEVar8 = pPStack_38->next;
    }
    uVar7 = (ulong)pEVar8[1];
    if ((ASCIIChars::classes[uVar7] & 0x40) != 0) {
      if (pPStack_38->inputLim < pEVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_48 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) {
LAB_00ecfa87:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *local_48 = 0;
        pEVar8 = pPStack_38->next;
        uVar7 = (ulong)pEVar8[1];
      }
      else {
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      }
      codePoint = (uint)(byte)ASCIIChars::values[uVar7];
      this_00 = pPStack_38;
      uVar10 = 2;
      do {
        uVar9 = uVar10 + 1;
        pEVar6 = this_00->inputLim;
        if (pEVar6 < pEVar8 + uVar9) {
LAB_00ecf898:
          if (pEVar6 < pEVar8 + uVar9) {
            return 0;
          }
          if (pEVar6 < pEVar8 + uVar10) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar2) goto LAB_00ecfa87;
            *local_48 = 0;
            pEVar8 = pPStack_38->next;
            this_00 = pPStack_38;
          }
          if (pEVar8[uVar10] != '}') {
            return 0;
          }
          uVar9 = uVar10 + 1;
          if (uVar9 < 3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_48 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x111,"(consumptionNumber >= 3)","consumptionNumber >= 3");
            if (!bVar2) goto LAB_00ecfa87;
            *local_48 = 0;
            this_00 = pPStack_38;
          }
          if (((trackSurrogatePair) && (*previousSurrogatePart == false)) &&
             (((this_00->scriptContext->config).threadConfig)->m_ES6Unicode == true)) {
            TrackIfSurrogatePair(pPStack_38,codePoint,this_00->next + -1,uVar10 + 2);
            this_00 = pPStack_38;
          }
          if (codePoint < 0x10000) {
            CVar4 = Chars<char16_t>::UTC(codePoint);
            *c = CVar4;
          }
          else {
            if (*previousSurrogatePart != true) {
              *previousSurrogatePart = true;
              Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,c,&local_3a);
              EVar3 = ECLookback(pPStack_38,1);
              if ((EVar3 != 'u') || (EVar3 = ECLookback(pPStack_38,2), EVar3 != '\\')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_48 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,300,"(ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\')",
                                   "ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\'");
                if (!bVar2) goto LAB_00ecfa87;
                *local_48 = 0;
              }
              ECRevert(pPStack_38,2);
              return uVar9;
            }
            *previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,&local_3a,c);
            this_00 = pPStack_38;
          }
          ECConsumeMultiUnit(this_00,uVar9);
          return uVar9;
        }
        if (pEVar6 < pEVar8 + uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00ecfa87;
          *local_48 = 0;
          pEVar6 = pPStack_38->inputLim;
          pEVar8 = pPStack_38->next;
          this_00 = pPStack_38;
        }
        uVar7 = (ulong)pEVar8[uVar10];
        if ((ASCIIChars::classes[uVar7] & 0x40) == 0) goto LAB_00ecf898;
        if (pEVar6 < pEVar8 + uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00ecfa87;
          *local_48 = 0;
          pEVar8 = pPStack_38->next;
          uVar7 = (ulong)pEVar8[uVar10];
          this_00 = pPStack_38;
        }
        codePoint = codePoint * 0x10 + (uint)(byte)ASCIIChars::values[uVar7];
        uVar10 = uVar9;
      } while (codePoint < 0x110000);
      DeferredFailIfUnicode(this_00,-0x7ff5e9d6);
    }
  }
  return 0;
}

Assistant:

int Parser<P, IsLiteral>::TryParseExtendedUnicodeEscape(Char& c, bool& previousSurrogatePart, bool trackSurrogatePair /* = false */)
    {
        if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            return 0;
        }

        if (!ECCanConsume(2) || ECLookahead(0) !='{' || !standardEncodedChars->IsHex(ECLookahead(1)))
        {
            return 0;
        }

        // The first character is mandatory to consume escape sequence, so we check for it above, at this stage we can set it as we already checked.
        codepoint_t codePoint = standardEncodedChars->DigitValue(ECLookahead(1));

        int i = 2;

        while(ECCanConsume(i + 1) && standardEncodedChars->IsHex(ECLookahead(i)))
        {
            codePoint <<= 4;
            codePoint += standardEncodedChars->DigitValue(ECLookahead(i));

            if (codePoint > 0x10FFFF)
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                return 0;
            }
            i++;
        }

        if(!ECCanConsume(i + 1) || ECLookahead(i) != '}')
        {
            return 0;
        }

        uint consumptionNumber = i + 1;
        Assert(consumptionNumber >= 3);

        if (!previousSurrogatePart && trackSurrogatePair && this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            // Current location
            TrackIfSurrogatePair(codePoint, (next - 1), consumptionNumber + 1);
        }

        char16 other;
        // Generally if this code point is a single character, then we take it and return.
        // If the character is made up of two characters then we emit the first and backtrack to the start of th escape sequence;
        // Following that we check if we have already seen the first character, and if so emit the second and consume the entire escape sequence.
        if (codePoint < 0x10000)
        {
            c = UTC(codePoint);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else if (previousSurrogatePart)
        {
            previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &other, &c);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else
        {
            previousSurrogatePart = true;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &c, &other);
            Assert(ECLookback(1) == 'u' && ECLookback(2) == '\\');
            ECRevert(2);
        }

        return consumptionNumber;
    }